

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::EnumDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,EnumDescriptor *this,DebugStringOptions *options)

{
  DebugStringOptions *options_local;
  EnumDescriptor *this_local;
  string *contents;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  DebugString(this,0,__return_storage_ptr__,options);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}